

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.c
# Opt level: O0

void av1_convolve_2d_sr_avx2(void)

{
  int iVar1;
  int iVar2;
  undefined4 in_ECX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  undefined8 in_stack_00000008;
  InterpFilterParams *in_stack_00000010;
  undefined4 in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int32_t tap_y;
  int32_t hh;
  int16_t im_block [17920];
  uint8_t *src_ptr;
  int32_t tap_y_1;
  int32_t tap_x_1;
  undefined8 in_stack_ffffffffffff7328;
  int subpel_qn;
  undefined4 in_stack_ffffffffffff7330;
  undefined4 in_stack_ffffffffffff7334;
  undefined2 in_stack_ffffffffffff7348;
  bool bVar3;
  undefined1 local_8c80 [10204];
  int in_stack_ffffffffffff9b5c;
  int in_stack_ffffffffffff9b60;
  int in_stack_ffffffffffff9b64;
  uint8_t *in_stack_ffffffffffff9b68;
  int in_stack_ffffffffffff9b74;
  uint8_t *in_stack_ffffffffffff9b78;
  
  subpel_qn = (int)((ulong)in_stack_ffffffffffff7328 >> 0x20);
  iVar1 = get_filter_tap((InterpFilterParams *)
                         CONCAT44(in_stack_ffffffffffff7334,in_stack_ffffffffffff7330),subpel_qn);
  iVar2 = get_filter_tap((InterpFilterParams *)
                         CONCAT44(in_stack_ffffffffffff7334,in_stack_ffffffffffff7330),subpel_qn);
  bVar3 = iVar1 == 0xc || iVar2 == 0xc;
  if (iVar1 == 0xc || iVar2 == 0xc) {
    convolve_2d_sr_general_avx2
              (in_stack_ffffffffffff9b78,in_stack_ffffffffffff9b74,in_stack_ffffffffffff9b68,
               in_stack_ffffffffffff9b64,in_stack_ffffffffffff9b60,in_stack_ffffffffffff9b5c,
               in_stack_00000010,
               (InterpFilterParams *)CONCAT44(in_stack_ffffffffffff7334,in_stack_00000018),
               in_stack_00000020,in_stack_00000028,
               (ConvolveParams *)
               CONCAT44(iVar2,CONCAT13(bVar3,CONCAT12(bVar3,in_stack_ffffffffffff7348))));
  }
  else {
    iVar1 = get_filter_tap((InterpFilterParams *)
                           CONCAT44(in_stack_ffffffffffff7334,in_stack_ffffffffffff7330),subpel_qn);
    iVar2 = get_filter_tap((InterpFilterParams *)
                           CONCAT44(in_stack_ffffffffffff7334,in_stack_ffffffffffff7330),subpel_qn);
    (**(code **)(av1_convolve_2d_sr_specialized_avx2_convolve_2d_sr_hor_tap_func_table +
                (long)iVar1 * 8))
              (in_RDI - ((iVar2 >> 1) + -1) * in_ESI,in_ESI,in_R8D,in_R9D + iVar2,in_stack_00000008,
               in_stack_00000018,local_8c80);
    (**(code **)(av1_convolve_2d_sr_specialized_avx2_convolve_2d_sr_ver_tap_func_table +
                (long)(int)(iVar2 - (uint)(in_stack_00000020 == 8)) * 8))
              (local_8c80,in_R8D,in_R9D,in_stack_00000010,in_stack_00000020,in_RDX,in_ECX);
  }
  return;
}

Assistant:

void av1_convolve_2d_sr_avx2(
    const uint8_t *src, int32_t src_stride, uint8_t *dst, int32_t dst_stride,
    int32_t w, int32_t h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int32_t subpel_x_qn,
    const int32_t subpel_y_qn, ConvolveParams *conv_params) {
#if CONFIG_SVT_AV1
  const int32_t tap_x = get_filter_tap(filter_params_x, subpel_x_qn);
  const int32_t tap_y = get_filter_tap(filter_params_y, subpel_y_qn);

  const bool use_general = (tap_x == 12 || tap_y == 12);
  if (use_general) {
    convolve_2d_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                filter_params_x, filter_params_y, subpel_x_qn,
                                subpel_y_qn, conv_params);
  } else {
    av1_convolve_2d_sr_specialized_avx2(src, src_stride, dst, dst_stride, w, h,
                                        filter_params_x, filter_params_y,
                                        subpel_x_qn, subpel_y_qn, conv_params);
  }
#else
  convolve_2d_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                              filter_params_x, filter_params_y, subpel_x_qn,
                              subpel_y_qn, conv_params);
#endif
}